

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# features.c
# Opt level: O2

void faup_features_init(faup_features_t *features)

{
  (features->scheme).field = FAUP_FEATURES_FIELD_SCHEME;
  (features->scheme).pos = -1;
  (features->hierarchical).field = FAUP_FEATURES_FIELD_HIERARCHICAL;
  (features->hierarchical).pos = -1;
  (features->credential).field = FAUP_FEATURES_FIELD_CREDENTIAL;
  (features->credential).pos = -1;
  (features->host).field = FAUP_FEATURES_FIELD_HOST;
  (features->host).pos = -1;
  (features->subdomain).field = FAUP_FEATURES_FIELD_SUBDOMAIN;
  (features->subdomain).pos = -1;
  (features->domain).field = FAUP_FEATURES_FIELD_DOMAIN;
  (features->domain).pos = -1;
  (features->domain_without_tld).field = FAUP_FEATURES_FIELD_DOMAIN_WITHOUT_TLD;
  (features->domain_without_tld).pos = -1;
  (features->port).field = FAUP_FEATURES_FIELD_PORT;
  (features->port).pos = -1;
  (features->resource_path).field = FAUP_FEATURES_FIELD_RESOURCE_PATH;
  (features->resource_path).pos = -1;
  (features->query_string).field = FAUP_FEATURES_FIELD_QUERY_STRING;
  (features->query_string).pos = -1;
  (features->fragment).field = FAUP_FEATURES_FIELD_FRAGMENT;
  (features->fragment).pos = -1;
  (features->tld).field = FAUP_FEATURES_FIELD_TLD;
  (features->tld).pos = -1;
  return;
}

Assistant:

void faup_features_init(faup_features_t* features)
{
	features->scheme.pos             = -1;
	features->hierarchical.pos       = -1;
	features->credential.pos         = -1;
	features->host.pos               = -1;
	features->subdomain.pos          = -1;
	features->domain.pos             = -1;
	features->domain_without_tld.pos = -1;
	features->port.pos               = -1;
	features->resource_path.pos      = -1;
	features->query_string.pos       = -1;
	features->fragment.pos           = -1;
	features->tld.pos                = -1;

	features->scheme.field             = FAUP_FEATURES_FIELD_SCHEME;
	features->hierarchical.field       = FAUP_FEATURES_FIELD_HIERARCHICAL;
	features->credential.field         = FAUP_FEATURES_FIELD_CREDENTIAL;
	features->host.field               = FAUP_FEATURES_FIELD_HOST;
	features->subdomain.field          = FAUP_FEATURES_FIELD_SUBDOMAIN;
	features->domain.field             = FAUP_FEATURES_FIELD_DOMAIN;
	features->domain_without_tld.field = FAUP_FEATURES_FIELD_DOMAIN_WITHOUT_TLD;
	features->port.field               = FAUP_FEATURES_FIELD_PORT;
	features->resource_path.field      = FAUP_FEATURES_FIELD_RESOURCE_PATH;
	features->query_string.field       = FAUP_FEATURES_FIELD_QUERY_STRING;
	features->fragment.field           = FAUP_FEATURES_FIELD_FRAGMENT;
	features->tld.field                = FAUP_FEATURES_FIELD_TLD;
}